

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O1

reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
__thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>
::
get_simplex_vertices<std::reverse_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
          (Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>
           *this,simplex_t idx,dimension_t dim,vertex_t n,
          reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *out)

{
  long lVar1;
  long lVar2;
  anon_class_24_3_68a6b7c5 pred;
  simplex_t *psVar3;
  undefined4 in_register_00000014;
  long extraout_RDX;
  uint uVar4;
  uint top;
  undefined7 in_register_00000031;
  char in_R8B;
  int in_R9D;
  simplex_t *__return_storage_ptr__;
  simplex_t *psVar5;
  bool bVar6;
  char local_61;
  Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>
  *local_60;
  simplex_t *local_58;
  reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *local_50;
  simplex_t *local_48;
  char *pcStack_40;
  simplex_t **local_38;
  
  psVar5 = (simplex_t *)CONCAT44(in_register_00000014,n);
  if ('\x01' < (char)(in_R8B + 1U)) {
    top = in_R9D - 1;
    __return_storage_ptr__ = (simplex_t *)(CONCAT71(in_register_00000031,dim) + 0x30);
    uVar4 = (uint)(byte)(in_R8B + 1U);
    local_60 = this;
    do {
      pcStack_40 = &local_61;
      local_38 = &local_58;
      pred.k = pcStack_40;
      pred.this = (Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_> *)
                  __return_storage_ptr__;
      pred.idx = (simplex_t *)local_38;
      local_61 = (char)uVar4;
      local_58 = psVar5;
      local_50 = out;
      local_48 = __return_storage_ptr__;
      top = Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>::
            get_max<Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>::get_max_vertex(unsigned__int128,signed_char,int)const::_lambda(int)_1_>
                      (top,uVar4 - 1,pred);
      lVar2 = *(long *)idx;
      lVar1 = lVar2 + -4;
      *(long *)idx = lVar1;
      *(uint *)(lVar2 + -4) = top;
      psVar3 = Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::operator()
                         (__return_storage_ptr__,
                          (Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_> *)
                          (ulong)top,(int)(char)uVar4,(dimension_t)lVar1);
      bVar6 = psVar5 < psVar3;
      psVar5 = (simplex_t *)((long)psVar5 - (long)psVar3);
      out = (reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
             *)((long)out + (-extraout_RDX - (ulong)bVar6));
      bVar6 = 2 < (int)uVar4;
      this = local_60;
      uVar4 = uVar4 - 1;
    } while (bVar6);
  }
  lVar1 = *(long *)idx;
  *(int *)(lVar1 + -4) = (int)psVar5;
  *(long *)this = lVar1;
  return (reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
          )(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this;
}

Assistant:

OutputIterator get_simplex_vertices(simplex_t idx, const dimension_t dim, vertex_t n,
        OutputIterator out) const {
      --n;
      for (dimension_t k = dim + 1; k > 1; --k) {
        n = simplex_encoding.get_max_vertex(idx, k, n);
        *out++ = n;
        idx -= simplex_encoding(n, k);
      }
      *out = static_cast<vertex_t>(idx);
      return out;
    }